

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

_Bool spki_records_are_equal(spki_record *r1,spki_record *r2)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  spki_record *r2_local;
  spki_record *r1_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (r1->asn == r2->asn) {
    if (r1->socket == r2->socket) {
      iVar2 = memcmp(r1,r2,0x14);
      if (iVar2 == 0) {
        iVar2 = memcmp(r1->spki,r2->spki,0x5b);
        if (iVar2 == 0) {
          r1_local._7_1_ = true;
        }
        else {
          r1_local._7_1_ = false;
        }
      }
      else {
        r1_local._7_1_ = false;
      }
    }
    else {
      r1_local._7_1_ = false;
    }
  }
  else {
    r1_local._7_1_ = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return r1_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

static bool spki_records_are_equal(struct spki_record *r1, struct spki_record *r2)
{
	if (r1->asn != r2->asn)
		return false;
	if (r1->socket != r2->socket)
		return false;
	if (memcmp(r1->ski, r2->ski, SKI_SIZE) != 0)
		return false;
	if (memcmp(r1->spki, r2->spki, SPKI_SIZE) != 0)
		return false;

	return true;
}